

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O3

CNscPStackEntry *
NscBuildStructDeclarationList(CNscPStackEntry *pList,CNscPStackEntry *pDeclaration)

{
  uchar *__src;
  size_t nSize;
  CNwnDoubleLinkList *pCVar1;
  CNscPStackEntry *pCVar2;
  CNscContext *pCVar3;
  CNwnDoubleLinkList *pCVar4;
  CNwnDoubleLinkList *pNext;
  
  if (pList == (CNscPStackEntry *)0x0) {
    pList = CNscContext::GetPStackEntryInt(g_pCtx);
    if (pList->m_nType != NscType_Unknown) {
LAB_0014b992:
      __assert_fail("m_nType == NscType_Unknown",
                    "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscPStackEntry.h"
                    ,0xee,"void CNscPStackEntry::SetType(NscType)");
    }
    if (pDeclaration->m_nType != NscType_Error) goto LAB_0014b914;
  }
  else {
    if (pList->m_nType == NscType_Error) goto LAB_0014b93e;
    if (pDeclaration->m_nType != NscType_Error) {
LAB_0014b914:
      __src = pDeclaration->m_pauchData;
      nSize = pDeclaration->m_nDataSize;
      CNscPStackEntry::MakeRoom(pList,nSize);
      memcpy(pList->m_pauchData + pList->m_nDataSize,__src,nSize);
      pList->m_nDataSize = pList->m_nDataSize + nSize;
      goto LAB_0014b93e;
    }
    if (pList->m_nType != NscType_Unknown) goto LAB_0014b992;
  }
  pList->m_nType = NscType_Error;
LAB_0014b93e:
  pCVar3 = g_pCtx;
  pCVar1 = (g_pCtx->m_listEntryFree).m_pPrev;
  pCVar2 = (CNscPStackEntry *)(pDeclaration->m_link).m_pNext;
  if (pCVar2 != pDeclaration) {
    pCVar4 = (pDeclaration->m_link).m_pPrev;
    (pCVar2->m_link).m_pPrev = pCVar4;
    pCVar4->m_pNext = (CNwnDoubleLinkList *)pCVar2;
    (pDeclaration->m_link).m_pNext = &pDeclaration->m_link;
  }
  pCVar4 = &pCVar3->m_listEntryFree;
  if ((CNscPStackEntry *)&pCVar3->m_listEntryFree == pDeclaration) {
    pCVar4 = pCVar1;
  }
  pCVar1 = pCVar4->m_pNext;
  (pDeclaration->m_link).m_pNext = pCVar1;
  (pDeclaration->m_link).m_pPrev = pCVar4;
  pCVar4->m_pNext = &pDeclaration->m_link;
  pCVar1->m_pPrev = &pDeclaration->m_link;
  return pList;
}

Assistant:

YYSTYPE NscBuildStructDeclarationList (YYSTYPE pList, YYSTYPE pDeclaration)
{
	CNscPStackEntry *pOut = pList;

	//
	// If there isn't an list, then create
	//

	if (pOut == NULL)
	{
		pOut = g_pCtx ->GetPStackEntry (__FILE__, __LINE__);
		pOut ->SetType (NscType_Unknown);
	}

	//
	// Process the parameter
	//

	CNscPStackEntry *pDeclarationEntry = pDeclaration;
	if (pOut ->GetType () != NscType_Error)
	{
		if (pDeclarationEntry ->GetType () != NscType_Error)
		{
			pOut ->AppendData (pDeclarationEntry ->GetData (),
				pDeclarationEntry ->GetDataSize ());
		}
		else
			pOut ->SetType (NscType_Error);
	}
	g_pCtx ->FreePStackEntry (pDeclarationEntry);


	//
	// Return the new expression
	//

	return pOut;
}